

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_verify(secp256k1_ge *a)

{
  secp256k1_fe *in_RDI;
  
  secp256k1_fe_verify(in_RDI);
  secp256k1_fe_verify(in_RDI + 1);
  secp256k1_fe_verify_magnitude(in_RDI,4);
  secp256k1_fe_verify_magnitude(in_RDI + 1,3);
  return;
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GE_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GE_Y_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}